

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

void __thiscall ki::protocol::dml::Message::Message(Message *this,MessageTemplate *message_template)

{
  Record *this_00;
  Record *record;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_write_to_0018bf00;
  this_00 = (Record *)0x0;
  MessageHeader::MessageHeader(&this->m_header,'\0','\0',0);
  (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_raw_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->m_template = message_template;
  if (message_template != (MessageTemplate *)0x0) {
    this_00 = (Record *)operator_new(0x50);
    record = MessageTemplate::get_record(message_template);
    ki::dml::Record::Record(this_00,record);
  }
  this->m_record = this_00;
  return;
}

Assistant:

Message::Message(const MessageTemplate *message_template)
	{
		m_template = message_template;
		if (m_template)
			m_record = new ki::dml::Record(m_template->get_record());
		else
			m_record = nullptr;
	}